

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::StreamingConcatenationExpression::serializeTo
          (StreamingConcatenationExpression *this,ASTSerializer *serializer)

{
  pointer pSVar1;
  size_type sVar2;
  Expression *__n;
  pointer pSVar3;
  string_view name;
  
  ASTSerializer::write(serializer,9,"sliceSize",this->sliceSize);
  if ((this->streams_).size_ == 0) {
    return;
  }
  name._M_str = "streams";
  name._M_len = 7;
  ASTSerializer::startArray(serializer,name);
  sVar2 = (this->streams_).size_;
  if (sVar2 != 0) {
    pSVar3 = (this->streams_).data_;
    pSVar1 = pSVar3 + sVar2;
    do {
      ASTSerializer::startObject(serializer);
      __n = (pSVar3->operand).ptr;
      if (__n == (Expression *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
                  );
      }
      ASTSerializer::write(serializer,7,"operand",(size_t)__n);
      if (pSVar3->withExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,8,"withExpr",(size_t)pSVar3->withExpr);
      }
      ASTSerializer::endObject(serializer);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void StreamingConcatenationExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("sliceSize", sliceSize);
    if (!streams().empty()) {
        serializer.startArray("streams");
        for (auto& stream : streams()) {
            serializer.startObject();
            serializer.write("operand", *stream.operand);
            if (stream.withExpr)
                serializer.write("withExpr", *stream.withExpr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}